

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 452.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<1,_452>::Type(Type<1,_452> *this,Type<1,_452> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)
           &(param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_452>_>).field_0x4;
  dVar1 = (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_452>_>).atomicWeightRatio_;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_452>_>).ZA_ =
       (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_452>_>).ZA_;
  *(undefined4 *)&(this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_452>_>).field_0x4 =
       uVar2;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_452>_>).atomicWeightRatio_ = dVar1;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                     *)&this->data_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                     *)&param_1->data_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 1, 452 > : 
    protected BaseWithoutMT< Type< 1, 452 > > {

    friend BaseWithoutMT< Type< 1, 452 > >;

  public:

    using Multiplicity = std::variant< PolynomialMultiplicity,  // LNU=1
                                       TabulatedMultiplicity >; // LNU=2

  private:

    /* fields */
    Multiplicity data_;

  public:

    /* constructors */
    #include "ENDFtk/section/1/452/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the fission multiplicity representation type
     */
    int LNU() const { return std::visit( [] ( const auto& v ) -> int
                                            { return v.LNU(); },
                                         this->data_ ); }

    /**
     *  @brief Return the fission multiplicity representation type
     */
    int representation() const { return this->LNU(); }

    /**
     *  @brief Return the fission multiplicity data
     */
    const Multiplicity& nubar() const { return this->data_; }

    /**
     *  @brief Return the number of lines in this MF1/MT452 section
     */
    long NC() const { return 1 + std::visit( [] ( const auto& v ) -> long
                                                { return v.NC(); },
                                             this->data_ ); }

    #include "ENDFtk/section/1/452/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber(){ return 452; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }